

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

RenameResult cmSystemTools::RenameFile(string *oldname,string *newname,Replace replace,string *err)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int *piVar4;
  Status local_80;
  string local_78;
  Status local_58;
  string local_50;
  string *local_30;
  string *err_local;
  string *psStack_20;
  Replace replace_local;
  string *newname_local;
  string *oldname_local;
  
  local_30 = err;
  err_local._4_4_ = replace;
  psStack_20 = newname;
  newname_local = oldname;
  if (replace == No) {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = link(pcVar2,pcVar3);
    if (iVar1 == 0) {
      oldname_local._4_4_ = Success;
    }
    else {
      piVar4 = __errno_location();
      if (*piVar4 == 0x11) {
        oldname_local._4_4_ = NoReplace;
      }
      else {
        if (local_30 != (string *)0x0) {
          local_58 = cmsys::Status::POSIX_errno();
          cmsys::Status::GetString_abi_cxx11_(&local_50,&local_58);
          std::__cxx11::string::operator=((string *)local_30,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
        }
        oldname_local._4_4_ = Failure;
      }
    }
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pcVar3 = (char *)std::__cxx11::string::c_str();
    iVar1 = rename(pcVar2,pcVar3);
    if (iVar1 == 0) {
      oldname_local._4_4_ = Success;
    }
    else {
      if (local_30 != (string *)0x0) {
        local_80 = cmsys::Status::POSIX_errno();
        cmsys::Status::GetString_abi_cxx11_(&local_78,&local_80);
        std::__cxx11::string::operator=((string *)local_30,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
      oldname_local._4_4_ = Failure;
    }
  }
  return oldname_local._4_4_;
}

Assistant:

cmSystemTools::RenameResult cmSystemTools::RenameFile(
  std::string const& oldname, std::string const& newname, Replace replace,
  std::string* err)
{
#ifdef _WIN32
#  ifndef INVALID_FILE_ATTRIBUTES
#    define INVALID_FILE_ATTRIBUTES ((DWORD)-1)
#  endif
  std::wstring const oldname_wstr =
    SystemTools::ConvertToWindowsExtendedPath(oldname);
  std::wstring const newname_wstr =
    SystemTools::ConvertToWindowsExtendedPath(newname);

  /* Windows MoveFileEx may not replace read-only or in-use files.  If it
     fails then remove the read-only attribute from any existing destination.
     Try multiple times since we may be racing against another process
     creating/opening the destination file just before our MoveFileEx.  */
  WindowsFileRetry retry = GetWindowsRetry(oldname_wstr);

  // Use RAII to set the attribute bit blocking Microsoft Search Indexing,
  // and restore the previous value upon return.
  SaveRestoreFileAttributes save_restore_file_attributes(
    oldname_wstr, FILE_ATTRIBUTE_NOT_CONTENT_INDEXED);

  DWORD move_last_error = 0;
  while (!cmMoveFile(oldname_wstr, newname_wstr, replace) && --retry.Count) {
    move_last_error = GetLastError();

    // There was no error ==> the operation is not yet complete.
    if (move_last_error == NO_ERROR) {
      break;
    }

    // Try again only if failure was due to access/sharing permissions.
    // Most often ERROR_ACCESS_DENIED (a.k.a. I/O error) for a directory, and
    // ERROR_SHARING_VIOLATION for a file, are caused by one of the following:
    // 1) Anti-Virus Software
    // 2) Windows Search Indexer
    // 3) Windows Explorer has an associated directory already opened.
    if (move_last_error != ERROR_ACCESS_DENIED &&
        move_last_error != ERROR_SHARING_VIOLATION) {
      if (replace == Replace::No && move_last_error == ERROR_ALREADY_EXISTS) {
        return RenameResult::NoReplace;
      }
      if (err) {
        *err = cmsys::Status::Windows(move_last_error).GetString();
      }
      return RenameResult::Failure;
    }

    DWORD const attrs = GetFileAttributesW(newname_wstr.c_str());
    if ((attrs != INVALID_FILE_ATTRIBUTES) &&
        (attrs & FILE_ATTRIBUTE_READONLY) &&
        // FILE_ATTRIBUTE_READONLY is not honored on directories.
        !(attrs & FILE_ATTRIBUTE_DIRECTORY)) {
      // Remove the read-only attribute from the destination file.
      SetFileAttributesW(newname_wstr.c_str(),
                         attrs & ~FILE_ATTRIBUTE_READONLY);
    } else {
      // The file may be temporarily in use so wait a bit.
      cmSystemTools::Delay(retry.Delay);
    }
  }

  // If we were successful, then there was no error.
  if (retry.Count > 0) {
    move_last_error = 0;
    // Restore the attributes on the new name.
    save_restore_file_attributes.SetPath(newname_wstr);
  }
  SetLastError(move_last_error);
  if (retry.Count > 0) {
    return RenameResult::Success;
  }
  if (replace == Replace::No && GetLastError() == ERROR_ALREADY_EXISTS) {
    return RenameResult::NoReplace;
  }
  if (err) {
    *err = cmsys::Status::Windows_GetLastError().GetString();
  }
  return RenameResult::Failure;
#else
  // On UNIX we have OS-provided calls to create 'newname' atomically.
  if (replace == Replace::No) {
    if (link(oldname.c_str(), newname.c_str()) == 0) {
      return RenameResult::Success;
    }
    if (errno == EEXIST) {
      return RenameResult::NoReplace;
    }
    if (err) {
      *err = cmsys::Status::POSIX_errno().GetString();
    }
    return RenameResult::Failure;
  }
  if (rename(oldname.c_str(), newname.c_str()) == 0) {
    return RenameResult::Success;
  }
  if (err) {
    *err = cmsys::Status::POSIX_errno().GetString();
  }
  return RenameResult::Failure;
#endif
}